

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar23;
  ulong uVar24;
  undefined4 uVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi;
  undefined1 auVar49 [16];
  uint uVar53;
  uint uVar54;
  vint4 ai;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  NodeRef stack [244];
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar33._4_4_ = fVar3;
  auVar33._0_4_ = fVar3;
  auVar33._8_4_ = fVar3;
  auVar33._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar34._4_4_ = fVar4;
  auVar34._0_4_ = fVar4;
  auVar34._8_4_ = fVar4;
  auVar34._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar35._4_4_ = fVar5;
  auVar35._0_4_ = fVar5;
  auVar35._8_4_ = fVar5;
  auVar35._12_4_ = fVar5;
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = fVar5 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar49._8_4_ = 0x80000000;
  auVar49._0_8_ = 0x8000000080000000;
  auVar49._12_4_ = 0x80000000;
  auVar44._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar44._8_4_ = -fVar3;
  auVar44._12_4_ = -fVar3;
  auVar45._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar45._8_4_ = -fVar4;
  auVar45._12_4_ = -fVar4;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar61._4_4_ = iVar6;
  auVar61._0_4_ = iVar6;
  auVar61._8_4_ = iVar6;
  auVar61._12_4_ = iVar6;
  iVar6 = (tray->tfar).field_0.i[k];
  auVar47._4_4_ = iVar6;
  auVar47._0_4_ = iVar6;
  auVar47._8_4_ = iVar6;
  auVar47._12_4_ = iVar6;
  auVar48._0_8_ = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
  auVar48._8_4_ = -fVar5;
  auVar48._12_4_ = -fVar5;
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  puVar27 = local_7d0;
  do {
    puVar26 = puVar27;
    if (puVar26 == &local_7d8) break;
    puVar27 = puVar26 + -1;
    uVar31 = puVar26[-1];
    do {
      if ((uVar31 & 8) == 0) {
        auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar22),auVar44,auVar33);
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar23),auVar45,auVar34);
        auVar50 = vpmaxsd_avx(auVar50,auVar56);
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + uVar24),auVar48,auVar35);
        auVar56 = vpmaxsd_avx(auVar56,auVar61);
        auVar50 = vpmaxsd_avx(auVar50,auVar56);
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar22 ^ 0x10)),auVar44,
                                  auVar33);
        auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar23 ^ 0x10)),auVar45,
                                  auVar34);
        auVar56 = vpminsd_avx(auVar56,auVar64);
        auVar64 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar31 + 0x20 + (uVar24 ^ 0x10)),auVar48,
                                  auVar35);
        auVar64 = vpminsd_avx(auVar64,auVar47);
        auVar56 = vpminsd_avx(auVar56,auVar64);
        auVar50 = vpcmpgtd_avx(auVar50,auVar56);
        uVar20 = vmovmskps_avx(auVar50);
        unaff_RBP = ((ulong)uVar20 ^ 0xf) & 0xff;
      }
      if ((uVar31 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar20 = 4;
        }
        else {
          uVar30 = uVar31 & 0xfffffffffffffff0;
          lVar29 = 0;
          for (uVar31 = unaff_RBP; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar20 = 0;
          uVar21 = unaff_RBP - 1 & unaff_RBP;
          uVar31 = *(ulong *)(uVar30 + lVar29 * 8);
          if (uVar21 != 0) {
            *puVar27 = uVar31;
            lVar29 = 0;
            for (uVar31 = uVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar31 = *(ulong *)(uVar30 + lVar29 * 8);
            for (uVar21 = uVar21 - 1 & uVar21; puVar27 = puVar27 + 1, uVar21 != 0;
                uVar21 = uVar21 - 1 & uVar21) {
              *puVar27 = uVar31;
              lVar29 = 0;
              for (uVar31 = uVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar31 = *(ulong *)(uVar30 + lVar29 * 8);
            }
          }
        }
      }
      else {
        uVar20 = 6;
      }
    } while (uVar20 == 0);
    if (uVar20 == 6) {
      uVar30 = (ulong)((uint)uVar31 & 0xf);
      uVar21 = uVar30 - 8;
      bVar32 = uVar30 != 8;
      if (bVar32) {
        uVar31 = uVar31 & 0xfffffffffffffff0;
        uVar7 = *(undefined4 *)(ray + k * 4);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x20);
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar50._4_4_ = uVar25;
        auVar50._0_4_ = uVar25;
        auVar50._8_4_ = uVar25;
        auVar50._12_4_ = uVar25;
        fVar3 = *(float *)(ray + k * 4 + 0x80);
        fVar4 = *(float *)(ray + k * 4 + 0xa0);
        auVar56._4_4_ = fVar4;
        auVar56._0_4_ = fVar4;
        auVar56._8_4_ = fVar4;
        auVar56._12_4_ = fVar4;
        fVar5 = *(float *)(ray + k * 4 + 0xc0);
        auVar64._4_4_ = fVar5;
        auVar64._0_4_ = fVar5;
        auVar64._8_4_ = fVar5;
        auVar64._12_4_ = fVar5;
        uVar30 = 0;
        do {
          lVar29 = uVar30 * 0xb0;
          auVar59 = *(undefined1 (*) [16])(uVar31 + 0x80 + lVar29);
          pauVar1 = (undefined1 (*) [16])(uVar31 + 0x40 + lVar29);
          auVar10 = *(undefined1 (*) [16])(uVar31 + 0x70 + lVar29);
          auVar60 = *(undefined1 (*) [16])(uVar31 + 0x50 + lVar29);
          auVar37._0_4_ = auVar59._0_4_ * *(float *)*pauVar1;
          auVar37._4_4_ = auVar59._4_4_ * *(float *)(*pauVar1 + 4);
          auVar37._8_4_ = auVar59._8_4_ * *(float *)(*pauVar1 + 8);
          auVar37._12_4_ = auVar59._12_4_ * *(float *)(*pauVar1 + 0xc);
          auVar52 = vfmsub231ps_fma(auVar37,auVar10,auVar60);
          pauVar2 = (undefined1 (*) [16])(uVar31 + 0x60 + lVar29);
          auVar12._4_4_ = uVar7;
          auVar12._0_4_ = uVar7;
          auVar12._8_4_ = uVar7;
          auVar12._12_4_ = uVar7;
          auVar12 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + lVar29),auVar12);
          auVar57._4_4_ = uVar8;
          auVar57._0_4_ = uVar8;
          auVar57._8_4_ = uVar8;
          auVar57._12_4_ = uVar8;
          auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x10 + lVar29),auVar57);
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + lVar29),auVar50);
          auVar57 = *(undefined1 (*) [16])(uVar31 + 0x30 + lVar29);
          auVar51._0_4_ = auVar60._0_4_ * *(float *)*pauVar2;
          auVar51._4_4_ = auVar60._4_4_ * *(float *)(*pauVar2 + 4);
          auVar51._8_4_ = auVar60._8_4_ * *(float *)(*pauVar2 + 8);
          auVar51._12_4_ = auVar60._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar51 = vfmsub231ps_fma(auVar51,auVar59,auVar57);
          auVar19._4_4_ = fVar3;
          auVar19._0_4_ = fVar3;
          auVar19._8_4_ = fVar3;
          auVar19._12_4_ = fVar3;
          local_8f8 = auVar37._0_4_;
          fStack_8f4 = auVar37._4_4_;
          fStack_8f0 = auVar37._8_4_;
          fStack_8ec = auVar37._12_4_;
          auVar38._0_4_ = fVar3 * local_8f8;
          auVar38._4_4_ = fVar3 * fStack_8f4;
          auVar38._8_4_ = fVar3 * fStack_8f0;
          auVar38._12_4_ = fVar3 * fStack_8ec;
          auVar38 = vfmsub231ps_fma(auVar38,auVar12,auVar56);
          auVar62._0_4_ = auVar59._0_4_ * auVar38._0_4_;
          auVar62._4_4_ = auVar59._4_4_ * auVar38._4_4_;
          auVar62._8_4_ = auVar59._8_4_ * auVar38._8_4_;
          auVar62._12_4_ = auVar59._12_4_ * auVar38._12_4_;
          auVar39._0_4_ = auVar60._0_4_ * auVar38._0_4_;
          auVar39._4_4_ = auVar60._4_4_ * auVar38._4_4_;
          auVar39._8_4_ = auVar60._8_4_ * auVar38._8_4_;
          auVar39._12_4_ = auVar60._12_4_ * auVar38._12_4_;
          auVar59._0_4_ = fVar5 * auVar12._0_4_;
          auVar59._4_4_ = fVar5 * auVar12._4_4_;
          auVar59._8_4_ = fVar5 * auVar12._8_4_;
          auVar59._12_4_ = fVar5 * auVar12._12_4_;
          auVar60 = vfmsub231ps_fma(auVar59,auVar43,auVar19);
          auVar59 = vfmadd231ps_fma(auVar62,auVar60,auVar10);
          local_888 = auVar57._0_4_;
          fStack_884 = auVar57._4_4_;
          fStack_880 = auVar57._8_4_;
          fStack_87c = auVar57._12_4_;
          auVar46._0_4_ = auVar10._0_4_ * local_888;
          auVar46._4_4_ = auVar10._4_4_ * fStack_884;
          auVar46._8_4_ = auVar10._8_4_ * fStack_880;
          auVar46._12_4_ = auVar10._12_4_ * fStack_87c;
          auVar46 = vfmsub231ps_fma(auVar46,*pauVar1,*pauVar2);
          auVar10 = vfmadd231ps_fma(auVar39,*pauVar1,auVar60);
          auVar60._0_4_ = fVar4 * auVar43._0_4_;
          auVar60._4_4_ = fVar4 * auVar43._4_4_;
          auVar60._8_4_ = fVar4 * auVar43._8_4_;
          auVar60._12_4_ = fVar4 * auVar43._12_4_;
          auVar39 = vfmsub231ps_fma(auVar60,auVar64,auVar37);
          auVar65._0_4_ = fVar5 * auVar46._0_4_;
          auVar65._4_4_ = fVar5 * auVar46._4_4_;
          auVar65._8_4_ = fVar5 * auVar46._8_4_;
          auVar65._12_4_ = fVar5 * auVar46._12_4_;
          auVar60 = vfmadd231ps_fma(auVar65,auVar56,auVar51);
          auVar60 = vfmadd231ps_fma(auVar60,auVar19,auVar52);
          auVar38 = vfmadd231ps_fma(auVar59,auVar39,*pauVar2);
          auVar59 = vandps_avx(auVar60,auVar49);
          uVar20 = auVar59._0_4_;
          auVar63._0_4_ = (float)(uVar20 ^ auVar38._0_4_);
          uVar53 = auVar59._4_4_;
          auVar63._4_4_ = (float)(uVar53 ^ auVar38._4_4_);
          uVar54 = auVar59._8_4_;
          auVar63._8_4_ = (float)(uVar54 ^ auVar38._8_4_);
          uVar55 = auVar59._12_4_;
          auVar63._12_4_ = (float)(uVar55 ^ auVar38._12_4_);
          auVar59 = vfmadd231ps_fma(auVar10,auVar39,auVar57);
          auVar40._0_4_ = (float)(uVar20 ^ auVar59._0_4_);
          auVar40._4_4_ = (float)(uVar53 ^ auVar59._4_4_);
          auVar40._8_4_ = (float)(uVar54 ^ auVar59._8_4_);
          auVar40._12_4_ = (float)(uVar55 ^ auVar59._12_4_);
          auVar57 = ZEXT816(0) << 0x20;
          auVar59 = vcmpps_avx(auVar63,auVar57,5);
          auVar10 = vcmpps_avx(auVar40,auVar57,5);
          auVar59 = vandps_avx(auVar59,auVar10);
          auVar10 = vcmpps_avx(auVar60,auVar57,4);
          auVar59 = vandps_avx(auVar59,auVar10);
          auVar41._0_4_ = auVar63._0_4_ + auVar40._0_4_;
          auVar41._4_4_ = auVar63._4_4_ + auVar40._4_4_;
          auVar41._8_4_ = auVar63._8_4_ + auVar40._8_4_;
          auVar41._12_4_ = auVar63._12_4_ + auVar40._12_4_;
          auVar10 = vandps_avx(auVar60,auVar36);
          auVar60 = vcmpps_avx(auVar41,auVar10,2);
          auVar57 = auVar60 & auVar59;
          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar57[0xf]) {
            bVar11 = false;
          }
          else {
            auVar59 = vandps_avx(auVar59,auVar60);
            auVar42._0_4_ = auVar46._0_4_ * auVar43._0_4_;
            auVar42._4_4_ = auVar46._4_4_ * auVar43._4_4_;
            auVar42._8_4_ = auVar46._8_4_ * auVar43._8_4_;
            auVar42._12_4_ = auVar46._12_4_ * auVar43._12_4_;
            auVar60 = vfmadd132ps_fma(auVar37,auVar42,auVar51);
            auVar60 = vfmadd132ps_fma(auVar12,auVar60,auVar52);
            auVar43._0_4_ = uVar20 ^ auVar60._0_4_;
            auVar43._4_4_ = uVar53 ^ auVar60._4_4_;
            auVar43._8_4_ = uVar54 ^ auVar60._8_4_;
            auVar43._12_4_ = uVar55 ^ auVar60._12_4_;
            fVar9 = *(float *)(ray + k * 4 + 0x60);
            auVar52._0_4_ = auVar10._0_4_ * fVar9;
            auVar52._4_4_ = auVar10._4_4_ * fVar9;
            auVar52._8_4_ = auVar10._8_4_ * fVar9;
            auVar52._12_4_ = auVar10._12_4_ * fVar9;
            auVar60 = vcmpps_avx(auVar52,auVar43,1);
            fVar9 = *(float *)(ray + k * 4 + 0x100);
            auVar58._0_4_ = auVar10._0_4_ * fVar9;
            auVar58._4_4_ = auVar10._4_4_ * fVar9;
            auVar58._8_4_ = auVar10._8_4_ * fVar9;
            auVar58._12_4_ = auVar10._12_4_ * fVar9;
            auVar10 = vcmpps_avx(auVar43,auVar58,2);
            auVar10 = vandps_avx(auVar60,auVar10);
            auVar60 = auVar59 & auVar10;
            bVar17 = (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar18 = (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar16 = (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
            bVar15 = auVar60[0xf] < '\0';
            bVar11 = ((bVar17 || bVar18) || bVar16) || bVar15;
            if (((bVar17 || bVar18) || bVar16) || bVar15) {
              local_878 = vandps_avx(auVar59,auVar10);
            }
          }
          if (bVar11) {
            uVar25 = vmovmskps_avx(local_878);
            uVar28 = CONCAT44((int)((ulong)puVar27 >> 0x20),uVar25);
            do {
              uVar13 = 0;
              for (uVar14 = uVar28; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                uVar13 = uVar13 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar29 + uVar31 + 0x90 + uVar13 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x120)) != 0) goto LAB_005d3f68;
              uVar28 = uVar28 ^ 1L << (uVar13 & 0x3f);
            } while (uVar28 != 0);
          }
          uVar30 = uVar30 + 1;
          bVar32 = uVar30 < uVar21;
        } while (uVar30 != uVar21);
      }
LAB_005d3f68:
      uVar20 = 0;
      if (bVar32) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar20 = 1;
      }
    }
  } while ((uVar20 & 3) == 0);
  return puVar26 != &local_7d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }